

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void ConvertRGBA32ToUV_SSE2(uint16_t *rgb,uint8_t *u,uint8_t *v,int width)

{
  uint16_t *puVar1;
  __m128i V1;
  __m128i U1;
  __m128i V0;
  __m128i U0;
  __m128i b;
  __m128i g;
  __m128i r;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  longlong local_68 [2];
  longlong local_58 [2];
  longlong local_48 [3];
  
  puVar1 = rgb + (int)((width & 0xfffffff0U) * 4);
  for (; rgb < puVar1; rgb = rgb + 0x40) {
    RGBA32PackedToPlanar_16b_SSE2(rgb,(__m128i *)local_48,&local_58,&local_68);
    ConvertRGBToUV_SSE2((__m128i *)local_48,&local_58,&local_68,(__m128i *)&local_78,
                        (__m128i *)&local_88);
    RGBA32PackedToPlanar_16b_SSE2(rgb + 0x20,(__m128i *)local_48,&local_58,&local_68);
    ConvertRGBToUV_SSE2((__m128i *)local_48,&local_58,&local_68,(__m128i *)&local_98,
                        (__m128i *)&local_a8);
    *u = (0 < local_78) * (local_78 < 0x100) * (char)local_78 - (0xff < local_78);
    u[1] = (0 < sStack_76) * (sStack_76 < 0x100) * (char)sStack_76 - (0xff < sStack_76);
    u[2] = (0 < sStack_74) * (sStack_74 < 0x100) * (char)sStack_74 - (0xff < sStack_74);
    u[3] = (0 < sStack_72) * (sStack_72 < 0x100) * (char)sStack_72 - (0xff < sStack_72);
    u[4] = (0 < sStack_70) * (sStack_70 < 0x100) * (char)sStack_70 - (0xff < sStack_70);
    u[5] = (0 < sStack_6e) * (sStack_6e < 0x100) * (char)sStack_6e - (0xff < sStack_6e);
    u[6] = (0 < sStack_6c) * (sStack_6c < 0x100) * (char)sStack_6c - (0xff < sStack_6c);
    u[7] = (0 < sStack_6a) * (sStack_6a < 0x100) * (char)sStack_6a - (0xff < sStack_6a);
    u[8] = (0 < local_98) * (local_98 < 0x100) * (char)local_98 - (0xff < local_98);
    u[9] = (0 < sStack_96) * (sStack_96 < 0x100) * (char)sStack_96 - (0xff < sStack_96);
    u[10] = (0 < sStack_94) * (sStack_94 < 0x100) * (char)sStack_94 - (0xff < sStack_94);
    u[0xb] = (0 < sStack_92) * (sStack_92 < 0x100) * (char)sStack_92 - (0xff < sStack_92);
    u[0xc] = (0 < sStack_90) * (sStack_90 < 0x100) * (char)sStack_90 - (0xff < sStack_90);
    u[0xd] = (0 < sStack_8e) * (sStack_8e < 0x100) * (char)sStack_8e - (0xff < sStack_8e);
    u[0xe] = (0 < sStack_8c) * (sStack_8c < 0x100) * (char)sStack_8c - (0xff < sStack_8c);
    u[0xf] = (0 < sStack_8a) * (sStack_8a < 0x100) * (char)sStack_8a - (0xff < sStack_8a);
    *v = (0 < local_88) * (local_88 < 0x100) * (char)local_88 - (0xff < local_88);
    v[1] = (0 < sStack_86) * (sStack_86 < 0x100) * (char)sStack_86 - (0xff < sStack_86);
    v[2] = (0 < sStack_84) * (sStack_84 < 0x100) * (char)sStack_84 - (0xff < sStack_84);
    v[3] = (0 < sStack_82) * (sStack_82 < 0x100) * (char)sStack_82 - (0xff < sStack_82);
    v[4] = (0 < sStack_80) * (sStack_80 < 0x100) * (char)sStack_80 - (0xff < sStack_80);
    v[5] = (0 < sStack_7e) * (sStack_7e < 0x100) * (char)sStack_7e - (0xff < sStack_7e);
    v[6] = (0 < sStack_7c) * (sStack_7c < 0x100) * (char)sStack_7c - (0xff < sStack_7c);
    v[7] = (0 < sStack_7a) * (sStack_7a < 0x100) * (char)sStack_7a - (0xff < sStack_7a);
    v[8] = (0 < local_a8) * (local_a8 < 0x100) * (char)local_a8 - (0xff < local_a8);
    v[9] = (0 < sStack_a6) * (sStack_a6 < 0x100) * (char)sStack_a6 - (0xff < sStack_a6);
    v[10] = (0 < sStack_a4) * (sStack_a4 < 0x100) * (char)sStack_a4 - (0xff < sStack_a4);
    v[0xb] = (0 < sStack_a2) * (sStack_a2 < 0x100) * (char)sStack_a2 - (0xff < sStack_a2);
    v[0xc] = (0 < sStack_a0) * (sStack_a0 < 0x100) * (char)sStack_a0 - (0xff < sStack_a0);
    v[0xd] = (0 < sStack_9e) * (sStack_9e < 0x100) * (char)sStack_9e - (0xff < sStack_9e);
    v[0xe] = (0 < sStack_9c) * (sStack_9c < 0x100) * (char)sStack_9c - (0xff < sStack_9c);
    v[0xf] = (0 < sStack_9a) * (sStack_9a < 0x100) * (char)sStack_9a - (0xff < sStack_9a);
    u = u + 0x10;
    v = v + 0x10;
  }
  if ((width & 0xfffffff0U) == width) {
    return;
  }
  WebPConvertRGBA32ToUV_C(rgb,u,v,width & 0xf);
  return;
}

Assistant:

static void ConvertRGBA32ToUV_SSE2(const uint16_t* rgb,
                                   uint8_t* u, uint8_t* v, int width) {
  const int max_width = width & ~15;
  const uint16_t* const last_rgb = rgb + 4 * max_width;
  while (rgb < last_rgb) {
    __m128i r, g, b, U0, V0, U1, V1;
    RGBA32PackedToPlanar_16b_SSE2(rgb +  0, &r, &g, &b);
    ConvertRGBToUV_SSE2(&r, &g, &b, &U0, &V0);
    RGBA32PackedToPlanar_16b_SSE2(rgb + 32, &r, &g, &b);
    ConvertRGBToUV_SSE2(&r, &g, &b, &U1, &V1);
    STORE_16(_mm_packus_epi16(U0, U1), u);
    STORE_16(_mm_packus_epi16(V0, V1), v);
    u += 16;
    v += 16;
    rgb += 2 * 32;
  }
  if (max_width < width) {  // left-over
    WebPConvertRGBA32ToUV_C(rgb, u, v, width - max_width);
  }
}